

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

void duckdb::TimeBucketOriginFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference a;
  reference b;
  reference c;
  long lVar2;
  ulong uVar3;
  int iVar4;
  idx_t count;
  code *fun;
  interval_t local_38;
  
  a = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  b = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  c = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  if ((*a != (value_type)0x2) || (*c != (value_type)0x2)) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
              (a,b,c,result,*(idx_t *)(args + 0x18),
               TimeBucket::OriginTernaryOperator::
               Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
              );
    return;
  }
  if ((((*(byte **)(a + 0x28) != (byte *)0x0) && ((**(byte **)(a + 0x28) & 1) == 0)) ||
      ((*(byte **)(c + 0x28) != (byte *)0x0 && ((**(byte **)(c + 0x28) & 1) == 0)))) ||
     (bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>((timestamp_t)**(int64_t **)(c + 0x20)),
     !bVar1)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  uVar3 = **(ulong **)(a + 0x20);
  local_38.micros = (*(ulong **)(a + 0x20))[1];
  local_38._0_8_ = uVar3;
  if ((int)uVar3 == 0) {
    lVar2 = duckdb::Interval::GetMicro(&local_38);
    if (0 < lVar2) {
      count = *(idx_t *)(args + 0x18);
      fun = TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::
            Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
      ;
      goto LAB_005ae1e5;
    }
    uVar3 = local_38._0_8_ & 0xffffffff;
    iVar4 = local_38.days;
  }
  else {
    iVar4 = (int)(uVar3 >> 0x20);
  }
  count = *(idx_t *)(args + 0x18);
  if ((((int)uVar3 < 1) || (iVar4 != 0)) || (local_38.micros != 0)) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
              (a,b,c,result,count,
               TimeBucket::OriginTernaryOperator::
               Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
              );
    return;
  }
  fun = TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::
        Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>;
LAB_005ae1e5:
  TernaryExecutor::
  ExecuteGeneric<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TernaryLambdaWrapper,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t)>
            (a,b,c,result,count,fun);
  return;
}

Assistant:

static void TimeBucketOriginFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];
	auto &origin_arg = args.data[2];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR &&
	    origin_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg) || ConstantVector::IsNull(origin_arg) ||
		    !Value::IsFinite(*ConstantVector::GetData<T>(origin_arg))) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
		    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
		    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
	}
}